

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCore.c
# Opt level: O0

void Cec_ManSimulation(Gia_Man_t *pAig,Cec_ParSim_t *pPars)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int nNonConsts;
  int fStop;
  int nCountNoRef;
  int nLitsNew;
  int nLitsOld;
  int r;
  Cec_ParSim_t *pPars_local;
  Gia_Man_t *pAig_local;
  
  nNonConsts = 0;
  bVar1 = false;
  Gia_ManRandom(1);
  if (pPars->fSeqSimulate != 0) {
    Abc_Print(1,"Performing rounds of random simulation of %d frames with %d words.\n",
              (ulong)(uint)pPars->nRounds,(ulong)(uint)pPars->nFrames,(ulong)(uint)pPars->nWords);
  }
  nCountNoRef = Gia_ManEquivCountLits(pAig);
  nLitsNew = 0;
  do {
    if (pPars->nRounds <= nLitsNew) {
LAB_007ed3fc:
      if ((nLitsNew == pPars->nRounds) || (bVar1)) {
        Abc_Print(1,"Random simulation is stopped after %d rounds.\n",(ulong)(uint)nLitsNew);
      }
      else {
        Abc_Print(1,"Random simulation saturated after %d rounds.\n",(ulong)(uint)nLitsNew);
      }
      if ((pPars->fCheckMiter != 0) && (uVar3 = Cec_ManCountNonConstOutputs(pAig), uVar3 != 0)) {
        Abc_Print(1,"The number of POs that are not const-0 candidates = %d.\n",(ulong)uVar3);
      }
      return;
    }
    iVar2 = Cec_ManSimulationOne(pAig,pPars);
    if (iVar2 != 0) {
      bVar1 = true;
      goto LAB_007ed3fc;
    }
    iVar2 = Gia_ManEquivCountLits(pAig);
    if ((nCountNoRef == 0) || (iVar2 < nCountNoRef)) {
      nNonConsts = 0;
      nCountNoRef = iVar2;
    }
    else {
      nNonConsts = nNonConsts + 1;
      if (nNonConsts == pPars->nNonRefines) {
        nLitsNew = nLitsNew + 1;
        goto LAB_007ed3fc;
      }
    }
    if (nCountNoRef != iVar2) {
      __assert_fail("nLitsOld == nLitsNew",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecCore.c"
                    ,0x13a,"void Cec_ManSimulation(Gia_Man_t *, Cec_ParSim_t *)");
    }
    nLitsNew = nLitsNew + 1;
  } while( true );
}

Assistant:

void Cec_ManSimulation( Gia_Man_t * pAig, Cec_ParSim_t * pPars )
{
    int r, nLitsOld, nLitsNew, nCountNoRef = 0, fStop = 0;
    Gia_ManRandom( 1 );
    if ( pPars->fSeqSimulate )
        Abc_Print( 1, "Performing rounds of random simulation of %d frames with %d words.\n", 
            pPars->nRounds, pPars->nFrames, pPars->nWords );
    nLitsOld = Gia_ManEquivCountLits( pAig );
    for ( r = 0; r < pPars->nRounds; r++ )
    {
        if ( Cec_ManSimulationOne( pAig, pPars ) )
        {
            fStop = 1;
            break;
        }
        // decide when to stop
        nLitsNew = Gia_ManEquivCountLits( pAig );
        if ( nLitsOld == 0 || nLitsOld > nLitsNew )
        {
            nLitsOld = nLitsNew;
            nCountNoRef = 0;
        }
        else if ( ++nCountNoRef == pPars->nNonRefines )
        {
            r++;
            break;
        }
        assert( nLitsOld == nLitsNew );
    }
//    if ( pPars->fVerbose )
    if ( r == pPars->nRounds || fStop )
        Abc_Print( 1, "Random simulation is stopped after %d rounds.\n", r );
    else
        Abc_Print( 1, "Random simulation saturated after %d rounds.\n", r );
    if ( pPars->fCheckMiter )
    {
        int nNonConsts = Cec_ManCountNonConstOutputs( pAig );
        if ( nNonConsts )
            Abc_Print( 1, "The number of POs that are not const-0 candidates = %d.\n", nNonConsts );
    }
}